

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdFindSupportOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v,int u)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int jVar;
  int iVar;
  uint uVar4;
  int Num2;
  
  iVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar3 = 1;
  }
  if ((p == (Dau_Dsd_t *)0x0) ||
     (cVar1 = p->Cache[pVars[(uint)v]][pVars[u]], uVar4 = (uint)cVar1, cVar1 == '\0')) {
    if (v < u) {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,v,u,1,3);
      Num2 = 2;
      iVar = v;
      jVar = u;
    }
    else {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,2,3);
      Num2 = 1;
      iVar = u;
      jVar = v;
    }
    iVar3 = Abc_TtCheckEqualCofs(pTruth,iVar3,iVar,jVar,0,Num2);
    uVar4 = iVar3 + iVar2 * 2;
    if (uVar4 == 3) {
      __assert_fail("Status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x62f,"int Dau_DsdFindSupportOne(Dau_Dsd_t *, word *, int *, int, int, int)");
    }
    uVar4 = uVar4 ^ 3;
    if (p != (Dau_Dsd_t *)0x0) {
      Dau_DsdInsertVarCache(p,pVars[(uint)v],pVars[u],uVar4);
    }
  }
  return uVar4;
}

Assistant:

static inline int Dau_DsdFindSupportOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v, int u )
{
    int nWords = Abc_TtWordNum(nVars);
    int Status = p ? Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) : 0;
    if ( Status == 0 )
    {
//        Status = (Abc_Tt6HasVar(tCof1, u) << 1) | Abc_Tt6HasVar(tCof0, u);
        if ( v < u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 1, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 0, 2);
        else // if ( v > u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 2, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 0, 1);
        assert( Status != 0 );
        if ( p )
            Dau_DsdInsertVarCache( p, pVars[v], pVars[u], Status );
    }
    return Status;
}